

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O2

string * __thiscall
OpenMPBindClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPBindClause *this)

{
  string parameter_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"bind (",(allocator<char> *)&local_50);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  if (this->bind_binding < OMPC_BIND_user) {
    std::__cxx11::string::assign((char *)&local_50);
  }
  else {
    std::operator<<((ostream *)&std::cout,"The parameter of bind clause is not supported.\n");
  }
  if (local_50._M_string_length == 0) {
    std::__cxx11::string::substr((ulong)&local_30,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_30);
  }
  else {
    std::operator+(&local_30,&local_50,") ");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPBindClause::toString() {

    std::string result = "bind (";
    std::string parameter_string;
    OpenMPBindClauseBinding bind_binding = this->getBindClauseBinding();
    switch (bind_binding) {
        case OMPC_BIND_teams:
            parameter_string = "teams";
            break;
        case OMPC_BIND_parallel:
            parameter_string = "parallel";
            break;
        case OMPC_BIND_thread:
            parameter_string = "thread";
            break;
        default:
            std::cout << "The parameter of bind clause is not supported.\n";
    };

    if (parameter_string.size() > 0) {
        result += parameter_string + ") ";
    }
    else {
        result = result.substr(0, result.size()-2);
    }

    return result;
}